

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPGetBoolNodeValue
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,xmlNodePtr node)

{
  int iVar1;
  xmlChar *str1;
  xmlSchemaTypePtr node_00;
  xmlChar *unaff_RBX;
  int iVar2;
  xmlChar *in_stack_ffffffffffffffd8;
  
  str1 = xmlNodeGetContent((xmlNode *)ownerItem);
  iVar1 = xmlStrEqual(str1,(xmlChar *)"true");
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = xmlStrEqual(str1,(xmlChar *)"false");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,"1");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(str1,"0");
        iVar2 = 0;
        if (iVar1 == 0) {
          node_00 = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
          iVar2 = 0;
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_INVALID_BOOLEAN,ownerItem,(xmlNodePtr)node_00,
                     (xmlSchemaTypePtr)0x0,(char *)str1,(xmlChar *)0x0,(char *)0x0,
                     in_stack_ffffffffffffffd8,unaff_RBX);
        }
      }
    }
    else {
      iVar2 = 0;
    }
  }
  if (str1 != (xmlChar *)0x0) {
    (*xmlFree)(str1);
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaPGetBoolNodeValue(xmlSchemaParserCtxtPtr ctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlNodePtr node)
{
    xmlChar *value = NULL;
    int res = 0;

    value = xmlNodeGetContent(node);
    /*
    * 3.2.2.1 Lexical representation
    * An instance of a datatype that is defined as `boolean`
    * can have the following legal literals {true, false, 1, 0}.
    */
    if (xmlStrEqual(BAD_CAST value, BAD_CAST "true"))
        res = 1;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "false"))
        res = 0;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "1"))
	res = 1;
    else if (xmlStrEqual(BAD_CAST value, BAD_CAST "0"))
        res = 0;
    else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_INVALID_BOOLEAN,
	    ownerItem, node,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN),
	    NULL, BAD_CAST value,
	    NULL, NULL, NULL);
    }
    if (value != NULL)
	xmlFree(value);
    return (res);
}